

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIO.cpp
# Opt level: O2

void anon_unknown.dwarf_23492::testFlatTiledImage1(string *fileName)

{
  uint __line;
  char cVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  char *__assertion;
  undefined8 local_b0;
  Header hdr;
  FlatImage img1;
  
  _hdr = 0;
  Imf_3_2::FlatImage::FlatImage(&img1,(Box *)&hdr,MIPMAP_LEVELS,ROUND_DOWN);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hdr,"H",(allocator<char> *)&local_b0);
  Imf_3_2::Image::insertChannel((string *)&img1,(PixelType)&hdr,1,1,true);
  std::__cxx11::string::~string((string *)&hdr);
  Imf_3_2::saveImage((string *)fileName,(Image *)&img1);
  local_b0 = 0;
  Imf_3_2::Header::Header((Header *)0x3f800000,0x3f800000,&hdr,0x40,0x40,&local_b0,0,3);
  plVar3 = (long *)Imf_3_2::loadImage((string *)fileName,&hdr);
  if (plVar3 != (long *)0x0) {
    lVar4 = __dynamic_cast(plVar3,&Imf_3_2::Image::typeinfo,&Imf_3_2::FlatImage::typeinfo,0);
    if (lVar4 != 0) {
      iVar2 = Imf_3_2::Image::levelMode();
      if (iVar2 == 1) {
        iVar2 = Imf_3_2::Image::levelRoundingMode();
        if (iVar2 == 0) {
          cVar1 = Imf_3_2::Header::hasTileDescription();
          if (cVar1 != '\0') {
            (**(code **)(*plVar3 + 8))(plVar3);
            Imf_3_2::Header::~Header(&hdr);
            Imf_3_2::FlatImage::~FlatImage(&img1);
            return;
          }
          __assertion = "hdr.hasTileDescription ()";
          __line = 0x53;
        }
        else {
          __assertion = "img2->levelRoundingMode () == ROUND_DOWN";
          __line = 0x52;
        }
      }
      else {
        __assertion = "img2->levelMode () == MIPMAP_LEVELS";
        __line = 0x51;
      }
      goto LAB_0010e089;
    }
  }
  __assertion = "dynamic_cast<FlatImage*> (img2)";
  __line = 0x50;
LAB_0010e089:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                ,__line,"void (anonymous namespace)::testFlatTiledImage1(const string &)");
}

Assistant:

void
testFlatTiledImage1 (const string& fileName)
{
    FlatImage img1 (Box2i (V2i (0, 0), V2i (5, 5)), MIPMAP_LEVELS, ROUND_DOWN);
    img1.insertChannel ("H", HALF);
    saveImage (fileName, img1);

    Header hdr;
    Image* img2 = loadImage (fileName, hdr);

    assert (dynamic_cast<FlatImage*> (img2));
    assert (img2->levelMode () == MIPMAP_LEVELS);
    assert (img2->levelRoundingMode () == ROUND_DOWN);
    assert (hdr.hasTileDescription ());

    delete img2;
}